

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_compat.cpp
# Opt level: O0

MPP_RET mpp_compat_update(MppCompat *compat,RK_S32 value)

{
  RK_S32 value_local;
  MppCompat *compat_local;
  
  if (compat == (MppCompat *)0x0) {
    compat_local._4_4_ = MPP_NOK;
  }
  else if ((int)compat->feature_id < 3) {
    if (compat == compats + compat->feature_id) {
      if (((compat->feature_type == MPP_COMPAT_BOOL) && (value != 0)) && (value != 1)) {
        compat_local._4_4_ = MPP_NOK;
      }
      else {
        compat->value_usr = value;
        compat_local._4_4_ = MPP_OK;
      }
    }
    else {
      compat_local._4_4_ = MPP_NOK;
    }
  }
  else {
    compat_local._4_4_ = MPP_NOK;
  }
  return compat_local._4_4_;
}

Assistant:

MPP_RET mpp_compat_update(MppCompat *compat, RK_S32 value)
{
    if (NULL == compat)
        return MPP_NOK;

    if (compat->feature_id >= MPP_COMPAT_BUTT)
        return MPP_NOK;

    if (compat != &compats[compat->feature_id])
        return MPP_NOK;

    if (compat->feature_type == MPP_COMPAT_BOOL)
        if (value != 0 && value != 1)
            return MPP_NOK;

    compat->value_usr = value;
    return MPP_OK;
}